

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O1

void __thiscall gui::Panel::draw(Panel *this,RenderTarget *target,RenderStates states)

{
  Widget *this_00;
  pointer psVar1;
  bool bVar2;
  Transform *right;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar3;
  shared_ptr<gui::Widget> *child;
  pointer psVar4;
  
  this_00 = &(this->super_Group).super_Container.super_Widget;
  bVar2 = Widget::isVisible(this_00);
  if (bVar2) {
    right = Widget::getTransform(this_00);
    sf::operator*=(&states.transform,right);
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rect_,&this->size_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       rect_,&states);
    pvVar3 = ContainerBase::getChildren((ContainerBase *)this);
    psVar1 = (pvVar3->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (pvVar3->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      sf::RenderTarget::draw
                (target,&((psVar4->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void Panel::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}